

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

PluginManager * beagle::plugin::PluginManager::instance(void)

{
  _Rb_tree_header *p_Var1;
  PluginManager *pPVar2;
  
  pPVar2 = ms_instance;
  if (ms_instance == (PluginManager *)0x0) {
    pPVar2 = (PluginManager *)operator_new(0x30);
    p_Var1 = &(pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header;
    (pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ms_instance = pPVar2;
    (pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
    ;
    (pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (pPVar2->m_plugin_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  return pPVar2;
}

Assistant:

PluginManager& PluginManager::instance()
{
    if (! ms_instance)
    ms_instance = new PluginManager();
    return *ms_instance;
}